

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LocalGraph.cpp
# Opt level: O0

void __thiscall wasm::LazyLocalGraph::makeFlower(LazyLocalGraph *this)

{
  bool bVar1;
  map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
  *__args_2;
  pointer this_00;
  LazyLocalGraph *local_10;
  LazyLocalGraph *this_local;
  
  local_10 = this;
  bVar1 = std::optional::operator_cast_to_bool((optional *)&this->locations);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    __assert_fail("!locations",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/LocalGraph.cpp"
                  ,0x285,"void wasm::LazyLocalGraph::makeFlower() const");
  }
  std::
  optional<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
  ::emplace<>(&this->locations);
  __args_2 = std::
             optional<std::map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>_>
             ::operator*(&this->locations);
  std::
  make_unique<wasm::LocalGraphFlower,std::unordered_map<wasm::LocalGet*,wasm::SmallSet<wasm::LocalSet*,2ul>,std::hash<wasm::LocalGet*>,std::equal_to<wasm::LocalGet*>,std::allocator<std::pair<wasm::LocalGet*const,wasm::SmallSet<wasm::LocalSet*,2ul>>>>&,std::map<wasm::Expression*,wasm::Expression**,std::less<wasm::Expression*>,std::allocator<std::pair<wasm::Expression*const,wasm::Expression**>>>&,wasm::Function*const&,wasm::Module*const&,std::optional<wasm::Expression::Id>const&>
            ((unordered_map<wasm::LocalGet_*,_wasm::SmallSet<wasm::LocalSet_*,_2UL>,_std::hash<wasm::LocalGet_*>,_std::equal_to<wasm::LocalGet_*>,_std::allocator<std::pair<wasm::LocalGet_*const,_wasm::SmallSet<wasm::LocalSet_*,_2UL>_>_>_>
              *)&stack0xffffffffffffffe8,
             (map<wasm::Expression_*,_wasm::Expression_**,_std::less<wasm::Expression_*>,_std::allocator<std::pair<wasm::Expression_*const,_wasm::Expression_**>_>_>
              *)&this->getSetsMap,(Function **)__args_2,(Module **)this,
             (optional<wasm::Expression::Id> *)&(this->super_LocalGraphBase).module);
  std::unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::operator=
            (&this->flower,
             (unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_> *)
             &stack0xffffffffffffffe8);
  std::unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::~unique_ptr
            ((unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_> *)
             &stack0xffffffffffffffe8);
  this_00 = std::unique_ptr<wasm::LocalGraphFlower,_std::default_delete<wasm::LocalGraphFlower>_>::
            operator->(&this->flower);
  LocalGraphFlower::prepareLaziness(this_00);
  return;
}

Assistant:

void LazyLocalGraph::makeFlower() const {
  // |locations| is set here and filled in by |flower|.
  assert(!locations);
  locations.emplace();

  flower = std::make_unique<LocalGraphFlower>(
    getSetsMap, *locations, func, module, queryClass);

  flower->prepareLaziness();

#ifdef LOCAL_GRAPH_DEBUG
  std::cout << "LazyLocalGraph::dump\n";
  for (auto& [get, sets] : getSetsMap) {
    std::cout << "GET\n" << get << " is influenced by\n";
    for (auto* set : sets) {
      std::cout << set << '\n';
    }
  }
  std::cout << "total locations: " << locations.size() << '\n';
#endif
}